

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcGetFunction(char *name,NULLCFuncPtr *func)

{
  uint uVar1;
  uint index;
  NULLCFuncPtr *func_local;
  char *name_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    name_local._7_1_ = '\0';
  }
  else if (func == (NULLCFuncPtr *)0x0) {
    NULLC::nullcLastError = "ERROR: passed pointer to NULLC function is \'null\'";
    name_local._7_1_ = '\0';
  }
  else {
    uVar1 = nullcFindFunctionIndex(name);
    if (uVar1 == 0xffffffff) {
      name_local._7_1_ = '\0';
    }
    else {
      func->id = uVar1;
      func->context = (void *)0x0;
      name_local._7_1_ = '\x01';
    }
  }
  return name_local._7_1_;
}

Assistant:

nullres nullcGetFunction(const char* name, NULLCFuncPtr* func)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	if(!func)
	{
		nullcLastError = "ERROR: passed pointer to NULLC function is 'null'";
		return false;
	}
	unsigned index = nullcFindFunctionIndex(name);
	if(index == ~0u)
		return false;
	func->id = index;
	func->context = NULL;
	return true;
}